

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

int32_t ucnv_toUChars_63(UConverter *cnv,UChar *dest,int32_t destCapacity,char *src,
                        int32_t srcLength,UErrorCode *pErrorCode)

{
  UChar *dest_00;
  UBool UVar1;
  size_t sVar2;
  char *sourceLimit;
  char16_t local_868 [4];
  UChar buffer [1024];
  int32_t local_5c;
  int32_t destLength;
  UChar *destLimit;
  UChar *originalDest;
  char *srcLimit;
  UErrorCode *pErrorCode_local;
  char *pcStack_30;
  int32_t srcLength_local;
  char *src_local;
  char16_t *pcStack_20;
  int32_t destCapacity_local;
  UChar *dest_local;
  UConverter *cnv_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) ||
     (pcStack_30 = src, src_local._4_4_ = destCapacity, pcStack_20 = dest, dest_local = (UChar *)cnv
     , UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    cnv_local._4_4_ = 0;
  }
  else if (((dest_local == (UChar *)0x0) || (src_local._4_4_ < 0)) ||
          ((((0 < src_local._4_4_ && (pcStack_20 == (UChar *)0x0)) || (srcLength < -1)) ||
           ((srcLength != 0 && (pcStack_30 == (char *)0x0)))))) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    cnv_local._4_4_ = 0;
  }
  else {
    ucnv_resetToUnicode_63((UConverter *)dest_local);
    dest_00 = pcStack_20;
    pErrorCode_local._4_4_ = srcLength;
    if (srcLength == -1) {
      sVar2 = strlen(pcStack_30);
      pErrorCode_local._4_4_ = (int32_t)sVar2;
    }
    if (pErrorCode_local._4_4_ < 1) {
      local_5c = 0;
    }
    else {
      sourceLimit = pcStack_30 + pErrorCode_local._4_4_;
      src_local._4_4_ = pinCapacity<char16_t>(pcStack_20,src_local._4_4_);
      ucnv_toUnicode_63((UConverter *)dest_local,&stack0xffffffffffffffe0,
                        pcStack_20 + src_local._4_4_,&stack0xffffffffffffffd0,sourceLimit,
                        (int32_t *)0x0,'\x01',pErrorCode);
      local_5c = (int32_t)((long)pcStack_20 - (long)dest_00 >> 1);
      if (*pErrorCode == U_BUFFER_OVERFLOW_ERROR) {
        do {
          pcStack_20 = local_868;
          *pErrorCode = U_ZERO_ERROR;
          ucnv_toUnicode_63((UConverter *)dest_local,&stack0xffffffffffffffe0,buffer + 0x3fc,
                            &stack0xffffffffffffffd0,sourceLimit,(int32_t *)0x0,'\x01',pErrorCode);
          local_5c = (int)((long)pcStack_20 - (long)local_868 >> 1) + local_5c;
        } while (*pErrorCode == U_BUFFER_OVERFLOW_ERROR);
      }
    }
    cnv_local._4_4_ = u_terminateUChars_63(dest_00,src_local._4_4_,local_5c,pErrorCode);
  }
  return cnv_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucnv_toUChars(UConverter *cnv,
              UChar *dest, int32_t destCapacity,
              const char *src, int32_t srcLength,
              UErrorCode *pErrorCode) {
    const char *srcLimit;
    UChar *originalDest, *destLimit;
    int32_t destLength;

    /* check arguments */
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if( cnv==NULL ||
        destCapacity<0 || (destCapacity>0 && dest==NULL) ||
        srcLength<-1 || (srcLength!=0 && src==NULL))
    {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* initialize */
    ucnv_resetToUnicode(cnv);
    originalDest=dest;
    if(srcLength==-1) {
        srcLength=(int32_t)uprv_strlen(src);
    }
    if(srcLength>0) {
        srcLimit=src+srcLength;
        destCapacity=pinCapacity(dest, destCapacity);
        destLimit=dest+destCapacity;

        /* perform the conversion */
        ucnv_toUnicode(cnv, &dest, destLimit, &src, srcLimit, 0, TRUE, pErrorCode);
        destLength=(int32_t)(dest-originalDest);

        /* if an overflow occurs, then get the preflighting length */
        if(*pErrorCode==U_BUFFER_OVERFLOW_ERROR)
        {
            UChar buffer[1024];

            destLimit=buffer+UPRV_LENGTHOF(buffer);
            do {
                dest=buffer;
                *pErrorCode=U_ZERO_ERROR;
                ucnv_toUnicode(cnv, &dest, destLimit, &src, srcLimit, 0, TRUE, pErrorCode);
                destLength+=(int32_t)(dest-buffer);
            }
            while(*pErrorCode==U_BUFFER_OVERFLOW_ERROR);
        }
    } else {
        destLength=0;
    }

    return u_terminateUChars(originalDest, destCapacity, destLength, pErrorCode);
}